

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

int voctplfnd(voccxdef *ctx,objnum verb_in,objnum prep,uchar *tplout,int *newstyle)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  mcmcxdef *ctx_00;
  mcmcxdef *in_RCX;
  ushort in_DX;
  int *in_R8;
  size_t siz;
  objnum verb;
  uint tplofs;
  int tplcnt;
  int found;
  uchar *thistpl;
  uchar *tplptr;
  mcmon in_stack_ffffffffffffffae;
  undefined2 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffba;
  uint local_40;
  uchar *in_stack_ffffffffffffffc8;
  objnum *in_stack_ffffffffffffffd0;
  
  uVar2 = objgetap(in_RCX,(objnum)((ulong)in_R8 >> 0x30),(prpnum)((ulong)in_R8 >> 0x20),
                   in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if (uVar2 == 0) {
    uVar2 = objgetap(in_RCX,(objnum)((ulong)in_R8 >> 0x30),(prpnum)((ulong)in_R8 >> 0x20),
                     in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    *in_R8 = 0;
  }
  else {
    *in_R8 = 1;
  }
  do {
    if (uVar2 != 0) {
      iVar3 = 10;
      if (*in_R8 != 0) {
        iVar3 = 0x10;
      }
      ctx_00 = (mcmcxdef *)(long)iVar3;
      in_stack_ffffffffffffffd0 =
           (objnum *)
           mcmlck((mcmcxdef *)
                  CONCAT44(uVar2,CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8)),0);
      in_stack_ffffffffffffffc8 = (uchar *)((long)in_stack_ffffffffffffffd0 + (ulong)uVar2 + 7);
      bVar1 = false;
      for (local_40 = (uint)*(byte *)((long)in_stack_ffffffffffffffd0 + (ulong)uVar2 + 6);
          local_40 != 0; local_40 = local_40 - 1) {
        uVar4 = osrp2(in_stack_ffffffffffffffc8);
        if ((uVar4 & 0xffff) == (uint)in_DX) {
          bVar1 = true;
          break;
        }
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + (long)(ctx_00->mcmcxmtb + -6);
      }
      mcmunlck(ctx_00,in_stack_ffffffffffffffae);
      if (bVar1) {
        memcpy(in_RCX,in_stack_ffffffffffffffc8,(size_t)ctx_00);
        return 1;
      }
    }
    uVar2 = objgetap(in_RCX,(objnum)((ulong)in_R8 >> 0x30),(prpnum)((ulong)in_R8 >> 0x20),
                     in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    if (uVar2 == 0) {
      uVar2 = objgetap(in_RCX,(objnum)((ulong)in_R8 >> 0x30),(prpnum)((ulong)in_R8 >> 0x20),
                       in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      *in_R8 = 0;
    }
    else {
      *in_R8 = 1;
    }
    if (uVar2 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int voctplfnd(voccxdef *ctx, objnum verb_in, objnum prep,
              uchar *tplout, int *newstyle)
{
    uchar  *tplptr;
    uchar  *thistpl;
    int     found;
    int     tplcnt;
    uint    tplofs;
    objnum  verb;

    /* look for a new-style template first */
    tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL2, &verb, FALSE);
    if (tplofs)
    {
        /* flag the presence of the new-style template */
        *newstyle = TRUE;
    }
    else
    {
        /* no new-style template - look for old version */
        tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL, &verb, FALSE);
        *newstyle = FALSE;
    }

    /* inherit templates until we run out of them */
    for (;;)
    {
        /* if we found something already, use it */
        if (tplofs)
        {
            size_t siz;

            /* figure the size of this template style */
            siz = (*newstyle ? VOCTPL2SIZ : VOCTPLSIZ);
            
            /* lock the verb object, and get the property value pointer */
            tplptr  = mcmlck(ctx->voccxmem, verb);
            thistpl = prpvalp(tplptr + tplofs);
            
            /* first byte is number of templates in array */
            tplcnt = *thistpl++;
            
            /* look for a template that matches the preposition object */
            for (found = FALSE ; tplcnt ; thistpl += siz, --tplcnt)
            {
                if (voctplpr(thistpl) == prep)
                {
                    found = TRUE;
                    break;
                }
            }
            
            /* unlock the object and return the value if we found one */
            mcmunlck(ctx->voccxmem, verb);
            if (found)
            {
                memcpy(tplout, thistpl, siz);
                return(TRUE);
            }
        }

        /* try inheriting a template (new-style, then old-style) */
        tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL2, &verb, TRUE);
        if (tplofs)
            *newstyle = TRUE;
        else
        {
            tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL, &verb, TRUE);
            *newstyle = FALSE;
        }

        /* return not-found if we couldn't inherit it */
        if (!tplofs)
            return FALSE;

        /* use the newly found verb */
        verb_in = verb;
    }
}